

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glesv1_cm_gears.c
# Opt level: O0

void delete_gear(gears_t_conflict1 *gears,int id)

{
  gear_conflict *__ptr;
  gear_conflict *gear;
  int id_local;
  gears_t_conflict1 *gears_local;
  
  __ptr = gears->gear[id];
  if (__ptr != (gear_conflict *)0x0) {
    if (__ptr->vbo != 0) {
      (*gears->glDeleteBuffers)(1,&__ptr->vbo);
    }
    if (__ptr->strips != (Strip *)0x0) {
      free(__ptr->strips);
    }
    if (__ptr->vertices != (Vertex *)0x0) {
      free(__ptr->vertices);
    }
    free(__ptr);
    gears->gear[id] = (gear_conflict *)0x0;
  }
  return;
}

Assistant:

static void delete_gear(gears_t *gears, int id)
{
  struct gear *gear = gears->gear[id];

  if (!gear) {
    return;
  }

  if (gear->vbo) {
    gears->glDeleteBuffers(1, &gear->vbo);
  }
  if (gear->strips) {
    free(gear->strips);
  }
  if (gear->vertices) {
    free(gear->vertices);
  }

  free(gear);

  gears->gear[id] = NULL;
}